

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_difflist * lyd_diff(lyd_node *first,lyd_node *second,int options)

{
  char **ppcVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte bVar4;
  LYS_NODE LVar5;
  lys_node *plVar6;
  ly_ctx *plVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  lyd_difflist *plVar11;
  long *plVar12;
  ly_set *plVar13;
  char *pcVar14;
  char *pcVar15;
  void *pvVar16;
  long *plVar17;
  long lVar18;
  LY_ERR *pLVar19;
  LYD_DIFFTYPE *pLVar20;
  lyd_node **pplVar21;
  uint uVar22;
  lys_ext *plVar23;
  ulong uVar24;
  lys_module *plVar25;
  ulong uVar26;
  lys_module *plVar27;
  lyd_node *plVar28;
  undefined8 uVar29;
  lyd_node *second_00;
  lys_module *plVar30;
  lys_ext *plVar31;
  lys_module *plVar32;
  size_t __n;
  lys_module *plVar33;
  lyd_difflist *plVar34;
  char *pcStack_b8;
  char *str1;
  char *local_a0;
  lys_module *local_98;
  lys_module *local_90;
  lyd_node *local_88;
  lys_module *local_80;
  uint local_74;
  ulong uStack_70;
  uint size2;
  uint local_64;
  lyd_difflist *local_60;
  ulong local_58;
  uint local_4c;
  lyd_difflist *local_48;
  uint local_3c;
  ly_set *plStack_38;
  uint size;
  
  local_4c = options;
  if (first == (lyd_node *)0x0) {
    if (second == (lyd_node *)0x0) {
      plVar11 = lyd_diff_init_difflist(&local_3c);
      return plVar11;
    }
    if (second->parent == (lyd_node *)0x0) {
      plVar11 = lyd_diff_init_difflist(&local_3c);
      uVar10 = 0;
      do {
        if (((local_4c & 1) != 0) || ((second->field_0x9 & 1) == 0)) {
          iVar9 = lyd_difflist_add(plVar11,&local_3c,uVar10,LYD_DIFF_CREATED,(lyd_node *)0x0,second)
          ;
          if (iVar9 != 0) goto LAB_0015e8a8;
          uVar10 = uVar10 + 1;
        }
        if ((local_4c >> 0xb & 1) != 0) {
          return plVar11;
        }
        second = second->next;
        if (second == (lyd_node *)0x0) {
          return plVar11;
        }
      } while( true );
    }
    pLVar19 = ly_errno_location();
    *pLVar19 = LY_EINVAL;
    pcVar14 = "%s: \"first\" parameter is NULL and \"second\" is not top level.";
    goto LAB_0015e8c4;
  }
  if (second == (lyd_node *)0x0) {
    plVar11 = lyd_diff_init_difflist(&local_3c);
    uVar10 = 0;
    do {
      if (((local_4c & 1) != 0) || ((first->field_0x9 & 1) == 0)) {
        iVar9 = lyd_difflist_add(plVar11,&local_3c,uVar10,LYD_DIFF_DELETED,first,(lyd_node *)0x0);
        if (iVar9 != 0) goto LAB_0015e8a8;
        uVar10 = uVar10 + 1;
      }
      if ((local_4c >> 0xb & 1) != 0) {
        return plVar11;
      }
      first = first->next;
      if (first == (lyd_node *)0x0) {
        return plVar11;
      }
    } while( true );
  }
  if (((uint)options >> 0xb & 1) == 0) {
    if (first->parent == (lyd_node *)0x0) {
      do {
        local_98 = (lys_module *)first;
        first = (lyd_node *)local_98->ref;
      } while ((lyd_node *)((lys_module *)local_98->ref)->dsc != (lyd_node *)0x0);
    }
    else {
      local_98 = (lys_module *)first->parent->child;
    }
    if (second->parent == (lyd_node *)0x0) {
      do {
        plVar30 = (lys_module *)second;
        second = (lyd_node *)plVar30->ref;
      } while ((lyd_node *)((lys_module *)plVar30->ref)->dsc != (lyd_node *)0x0);
    }
    else {
      plVar30 = (lys_module *)second->parent->child;
    }
    plVar28 = (lyd_node *)plVar30->org;
    if ((lyd_node *)local_98->org == (lyd_node *)0x0) {
      if (plVar28 != (lyd_node *)0x0) goto LAB_0015e0b6;
    }
    else if ((plVar28 != (lyd_node *)0x0) &&
            (((lyd_node *)local_98->org)->schema != plVar28->schema)) {
LAB_0015e0b6:
      pLVar19 = ly_errno_location();
      *pLVar19 = LY_EINVAL;
      pcVar14 = "%s: incompatible trees with different parents.";
      goto LAB_0015e8c4;
    }
  }
  else {
    if (first->schema != second->schema) {
      pLVar19 = ly_errno_location();
      *pLVar19 = LY_EINVAL;
      pcVar14 = "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.";
      goto LAB_0015e8c4;
    }
    local_98 = (lys_module *)first->child;
    plVar30 = (lys_module *)second->child;
  }
  if (local_98 == plVar30) {
    pLVar19 = ly_errno_location();
    *pLVar19 = LY_EINVAL;
    pcVar14 = "%s: comparing the same tree does not make sense.";
LAB_0015e8c4:
    ly_log(LY_LLERR,pcVar14,"lyd_diff");
    return (lyd_difflist *)0x0;
  }
  plVar11 = lyd_diff_init_difflist(&local_3c);
  local_60 = lyd_diff_init_difflist(&local_74);
  plVar12 = (long *)malloc(0x18);
  *(undefined4 *)(plVar12 + 2) = 0;
  plVar13 = (ly_set *)calloc(1,0x10);
  plVar12[1] = (long)plVar13;
  *plVar12 = 0;
  plStack_38 = (ly_set *)calloc(1,0x10);
  local_48 = plVar11;
  if (plVar30 != (lys_module *)0x0) {
    local_64 = local_4c & 1;
    uStack_70 = 0;
    local_90 = local_98;
    local_88 = (lyd_node *)0x0;
    local_58 = 0;
    plVar13 = plStack_38;
    plVar25 = plVar30;
LAB_0015e18a:
    plVar32 = plVar25;
    if ((local_64 == 0) && (((ulong)plVar32->name & 0x100) != 0)) goto LAB_0015e50b;
    if (local_90 == (lys_module *)0x0) {
      uVar10 = (uint)uStack_70;
      uVar22 = uVar10 + 1;
    }
    else {
      uVar10 = (uint)local_58;
      plVar25 = local_90;
      do {
        if (plVar25->ctx == plVar32->ctx) {
          plVar13 = (ly_set *)plVar12[1];
          pcStack_b8 = (char *)0x0;
          local_a0 = (char *)0x0;
          bVar4 = *(undefined1 *)((long)&plVar25->name + 1);
          if ((local_64 != 0) || (plVar11 = local_48, (bVar4 & 1) == 0)) {
            LVar5 = ((lys_node *)plVar25->ctx)->nodetype;
            if ((int)LVar5 < 0x10) {
              if (LVar5 == LYS_LEAFLIST) {
LAB_0015e1fd:
                iVar9 = lyd_list_equal((lyd_node *)plVar25,(lyd_node *)plVar32,0,local_64,0);
                plVar11 = local_48;
                if (iVar9 == 0) goto LAB_0015e225;
                if (iVar9 == -1) goto LAB_0015eccb;
                plVar27 = (lys_module *)plVar25->ctx;
                if (((ulong)plVar27->dsc & 0x100) == 0) goto LAB_0015e4e7;
                uVar10 = plStack_38->number;
                if ((ulong)uVar10 != 0) {
                  uVar26 = 0;
                  goto LAB_0015e2f6;
                }
                uVar26 = 0;
                goto LAB_0015e495;
              }
              if (LVar5 == LYS_CONTAINER) goto LAB_0015e4e7;
              uVar10 = (uint)local_58;
              if (LVar5 != LYS_LEAF) {
LAB_0015eca0:
                pLVar19 = ly_errno_location();
                *pLVar19 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                       ,0xa24);
                plVar11 = local_48;
                goto LAB_0015eccb;
              }
              if (((lys_module *)plVar25->contact == (lys_module *)plVar32->contact) &&
                 ((local_64 == 0 || (((bVar4 ^ *(undefined1 *)((long)&plVar32->name + 1)) & 1) == 0)
                  ))) goto LAB_0015e507;
            }
            else {
              if (LVar5 == LYS_LIST) goto LAB_0015e1fd;
              if ((LVar5 != LYS_ANYXML) && (LVar5 != LYS_ANYDATA)) goto LAB_0015eca0;
              pcVar14 = plVar25->filepath;
              if (pcVar14 == (char *)0x0) {
                lyxml_print_mem(&pcStack_b8,(lyxml_elem *)0x0,0x10);
                pcVar14 = lydict_insert_zc((ly_ctx *)((plVar25->ctx->dict).recs[2].next)->next,
                                           pcStack_b8);
                plVar25->filepath = pcVar14;
              }
              pcVar15 = plVar32->filepath;
              pcStack_b8 = pcVar14;
              if (pcVar15 == (char *)0x0) {
                lyxml_print_mem(&local_a0,(lyxml_elem *)0x0,0x10);
                pcVar15 = lydict_insert_zc((ly_ctx *)((plVar32->ctx->dict).recs[2].next)->next,
                                           local_a0);
                plVar32->filepath = pcVar15;
              }
              local_a0 = pcVar15;
              if (pcStack_b8 == pcVar15) goto LAB_0015e507;
            }
            iVar9 = lyd_difflist_add(local_48,&local_3c,uVar10,LYD_DIFF_CHANGED,(lyd_node *)plVar25,
                                     (lyd_node *)plVar32);
            plVar11 = local_48;
            if (iVar9 != 0) goto LAB_0015eccb;
            local_58 = (ulong)(uVar10 + 1);
            goto LAB_0015e507;
          }
        }
LAB_0015e225:
        plVar25 = (lys_module *)plVar25->dsc;
      } while (plVar25 != (lys_module *)0x0);
      uVar10 = (uint)uStack_70;
      uVar22 = uVar10 + 1;
      if (local_90 != (lys_module *)0x0) {
        iVar9 = lyd_difflist_add(local_60,&local_74,uVar10,LYD_DIFF_CREATED,
                                 (lyd_node *)local_90->org,(lyd_node *)plVar32);
        if (iVar9 != 0) goto joined_r0x0015ec07;
        plVar25 = plVar32;
        if (((ulong)(plVar32->ctx->dict).recs[1].next & 0x100) == 0) {
          uStack_70 = (ulong)uVar22;
          plVar13 = plStack_38;
          goto LAB_0015e50b;
        }
        do {
          plVar25 = (lys_module *)plVar25->ref;
          if (plVar25->dsc == (char *)0x0) {
            plVar25 = (lys_module *)0x0;
            break;
          }
        } while (plVar25->ctx != plVar32->ctx);
        iVar9 = lyd_difflist_add(local_60,&local_74,uVar22,LYD_DIFF_MOVEDAFTER2,(lyd_node *)plVar25,
                                 (lyd_node *)plVar32);
        if (iVar9 != 0) goto joined_r0x0015ec07;
        uStack_70 = (ulong)(uVar10 + 2);
        plVar13 = plStack_38;
        goto LAB_0015e50b;
      }
    }
    iVar9 = lyd_difflist_add(local_60,&local_74,uVar10,LYD_DIFF_CREATED,local_88,(lyd_node *)plVar32
                            );
    uStack_70 = (ulong)uVar22;
    plVar13 = plStack_38;
    if (iVar9 != 0) goto joined_r0x0015ec07;
    goto LAB_0015e50b;
  }
  local_58 = 0;
  uStack_70 = 0;
LAB_0015e8f5:
  ly_set_free(plVar13);
  free(plVar12);
  if (local_98 != (lys_module *)0x0) {
    plVar30 = local_98;
    while (plVar25 = plVar30, (char)*(byte *)&plVar25->name < '\0') {
      *(byte *)&plVar25->name = *(byte *)&plVar25->name & 0x7f;
LAB_0015e96f:
      if (((((lys_node *)plVar25->ctx)->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) !=
           LYS_UNKNOWN) ||
         (plVar30 = (lys_module *)plVar25->contact,
         (lys_module *)plVar25->contact == (lys_module *)0x0)) {
LAB_0015e982:
        plVar30 = (lys_module *)plVar25->dsc;
        if ((lys_module *)plVar25->dsc == (lys_module *)0x0) {
          do {
            plVar25 = (lys_module *)((lys_node *)plVar25)->iffeature;
            if (plVar25 == (lys_module *)local_98->org) goto LAB_0015e9c8;
            plVar30 = *(lys_module **)&((lys_node *)plVar25)->flags;
          } while (*(lys_module **)&((lys_node *)plVar25)->flags == (lys_module *)0x0);
        }
      }
    }
    if (((local_4c & 1) == 0) && (((ulong)plVar25->name & 0x100) != 0)) goto LAB_0015e96f;
    uVar10 = (uint)local_58;
    iVar9 = lyd_difflist_add(plVar11,&local_3c,uVar10,LYD_DIFF_DELETED,(lyd_node *)plVar25,
                             (lyd_node *)0x0);
    plVar13 = plStack_38;
    plVar34 = local_60;
    if (iVar9 == 0) {
      local_58 = (ulong)(uVar10 + 1);
      goto LAB_0015e982;
    }
    goto LAB_0015ecf0;
  }
LAB_0015e9c8:
  uVar10 = plStack_38->number;
  plVar13 = plStack_38;
  if (uVar10 != 0) {
    uVar26 = 0;
    do {
      plVar6 = (plVar13->set).s[uVar26];
      plVar31 = (lys_ext *)plVar6->ext;
      plVar23 = plVar31;
      if (*(int *)&plVar31->dsc != 0) {
        do {
          while (*(int *)&plVar31->dsc != 0) {
            uVar10 = *(uint *)&plVar6->ref;
            lVar18 = *(long *)&plVar6->flags;
            if (uVar10 == 0) {
              uVar24 = 0;
            }
            else {
              plVar12 = (long *)(lVar18 + 0x10);
              uVar24 = 0;
              do {
                if ((lys_ext *)*plVar12 == plVar31) goto LAB_0015ea32;
                uVar22 = (int)uVar24 + 1;
                uVar24 = (ulong)uVar22;
                plVar12 = plVar12 + 3;
              } while (uVar10 != uVar22);
              uVar24 = (ulong)uVar10;
            }
LAB_0015ea32:
            uVar10 = (uint)uVar24;
            plVar28 = *(lyd_node **)(lVar18 + uVar24 * 0x18);
            puVar3 = (undefined8 *)(lVar18 + 8 + uVar24 * 0x18);
            pcStack_b8 = (char *)*puVar3;
            str1 = (char *)puVar3[1];
            iVar9 = *(int *)&plVar31->dsc;
            if (iVar9 < 1) {
              while (iVar9 != 0) {
                lVar8 = uVar24 * 0x18;
                uVar10 = (int)uVar24 - 1;
                uVar24 = (ulong)uVar10;
                *(undefined8 *)(lVar18 + 0x10 + lVar8) =
                     *(undefined8 *)(lVar18 + 0x10 + uVar24 * 0x18);
                puVar3 = (undefined8 *)(lVar18 + uVar24 * 0x18);
                uVar29 = puVar3[1];
                *(undefined8 *)(lVar18 + lVar8) = *puVar3;
                ((undefined8 *)(lVar18 + lVar8))[1] = uVar29;
                lVar18 = *(long *)&plVar6->flags;
                piVar2 = (int *)(*(long *)(lVar18 + 0x10 + lVar8) + 8);
                *piVar2 = *piVar2 + -1;
                ppcVar1 = &plVar31->dsc;
                *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
                iVar9 = *(int *)ppcVar1;
              }
            }
            else {
              do {
                lVar8 = uVar24 * 0x18;
                uVar10 = (int)uVar24 + 1;
                uVar24 = (ulong)uVar10;
                *(undefined8 *)(lVar18 + 0x10 + lVar8) =
                     *(undefined8 *)(lVar18 + 0x10 + uVar24 * 0x18);
                puVar3 = (undefined8 *)(lVar18 + uVar24 * 0x18);
                uVar29 = puVar3[1];
                *(undefined8 *)(lVar18 + lVar8) = *puVar3;
                ((undefined8 *)(lVar18 + lVar8))[1] = uVar29;
                lVar18 = *(long *)&plVar6->flags;
                piVar2 = (int *)(*(long *)(lVar18 + 0x10 + lVar8) + 8);
                *piVar2 = *piVar2 + 1;
                ppcVar1 = &plVar31->dsc;
                *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
              } while (*(int *)ppcVar1 != 0);
            }
            *(lyd_node **)(lVar18 + uVar24 * 0x18) = plVar28;
            puVar3 = (undefined8 *)(lVar18 + 8 + uVar24 * 0x18);
            *puVar3 = pcStack_b8;
            puVar3[1] = str1;
            if (uVar10 == 0) {
              second_00 = (lyd_node *)0x0;
            }
            else {
              second_00 = *(lyd_node **)(*(long *)&plVar6->flags + (ulong)(uVar10 - 1) * 0x18);
            }
            uVar10 = (uint)local_58;
            iVar9 = lyd_difflist_add(local_48,&local_3c,uVar10,LYD_DIFF_MOVEDAFTER1,plVar28,
                                     second_00);
            plVar13 = plStack_38;
            plVar11 = local_48;
            plVar34 = local_60;
            if (iVar9 != 0) goto LAB_0015ecf0;
            local_58 = (ulong)(uVar10 + 1);
            plVar31 = (lys_ext *)plVar31->name;
            plVar23 = plVar31;
          }
          plVar31 = (lys_ext *)plVar31->name;
        } while (plVar31 != plVar23);
        uVar10 = plVar13->number;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar10);
  }
  diff_ordset_free(plVar13);
  plVar11 = local_48;
  uVar26 = local_58;
  plVar34 = local_60;
  iVar9 = (int)uStack_70;
  if (iVar9 == 0) goto LAB_0015ebb8;
  uVar10 = iVar9 + (int)local_58 + 1;
  if (uVar10 < local_3c) {
LAB_0015eb5c:
    uVar26 = uVar26 & 0xffffffff;
    memcpy(plVar11->type + uVar26,plVar34->type,(ulong)(iVar9 + 1) * 4);
    __n = (ulong)(iVar9 + 1) << 3;
    memcpy(plVar11->first + uVar26,local_60->first,__n);
    plVar34 = local_60;
    memcpy(plVar11->second + uVar26,local_60->second,__n);
LAB_0015ebb8:
    lyd_free_diff(plVar34);
    ly_err_clean(1);
    return local_48;
  }
  local_3c = uVar10;
  pLVar20 = (LYD_DIFFTYPE *)realloc(local_48->type,(ulong)uVar10 << 2);
  if (pLVar20 != (LYD_DIFFTYPE *)0x0) {
    plVar11->type = pLVar20;
    pplVar21 = (lyd_node **)realloc(plVar11->first,(ulong)local_3c << 3);
    if (pplVar21 != (lyd_node **)0x0) {
      plVar11->first = pplVar21;
      pplVar21 = (lyd_node **)realloc(plVar11->second,(ulong)local_3c << 3);
      if (pplVar21 != (lyd_node **)0x0) {
        plVar11->second = pplVar21;
        goto LAB_0015eb5c;
      }
    }
  }
  pLVar19 = ly_errno_location();
  *pLVar19 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_diff");
  goto LAB_0015e8ab;
  while (uVar26 = uVar26 + 1, uVar10 != uVar26) {
LAB_0015e2f6:
    if (((lys_module *)(plStack_38->set).s[uVar26]->name == plVar27) &&
       ((plStack_38->set).s[uVar26]->dsc == plVar25->org)) goto LAB_0015e495;
  }
LAB_0015e49a:
  local_80 = plVar27;
  plVar17 = (long *)calloc(1,0x30);
  *plVar17 = (long)local_80;
  plVar17[1] = (long)plVar25->org;
  ly_set_add(plStack_38,plVar17,1);
  uVar22 = uVar10;
LAB_0015e4da:
  ppcVar1 = &(plStack_38->set).s[uVar22]->ref;
  *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
LAB_0015e4e7:
  *(byte *)&plVar32->name = *(byte *)&plVar32->name | 0x80;
  ly_set_add(plVar13,plVar25,1);
LAB_0015e507:
  *(byte *)&plVar25->name = *(byte *)&plVar25->name | 0x80;
  plVar13 = plStack_38;
  plVar11 = local_48;
LAB_0015e50b:
  plVar25 = (lys_module *)plVar32->dsc;
  if ((lys_module *)plVar32->dsc == (lys_module *)0x0) {
    uVar26 = (ulong)plVar13->number;
    while ((uVar26 != 0 &&
           (plVar6 = (plVar13->set).s[uVar26 - 1], lVar18._0_2_ = plVar6->flags,
           lVar18._2_1_ = plVar6->ext_size, lVar18._3_1_ = plVar6->iffeature_size,
           lVar18._4_1_ = plVar6->padding[0], lVar18._5_1_ = plVar6->padding[1],
           lVar18._6_1_ = plVar6->padding[2], lVar18._7_1_ = plVar6->padding[3], lVar18 == 0))) {
      uVar26 = uVar26 - 1;
      pvVar16 = calloc((ulong)*(uint *)&plVar6->ref,0x18);
      *(void **)&plVar6->flags = pvVar16;
      plVar6->ext = (lys_ext_instance **)0x0;
      *(undefined4 *)&plVar6->ref = 0;
      plVar13 = plStack_38;
    }
    plVar27 = plVar30;
    plVar11 = local_48;
    plVar33 = plVar30;
    plVar17 = plVar12;
    if (((lyd_node *)plVar32->org == (lyd_node *)plVar30->org) ||
       (plVar27 = (lys_module *)((lyd_node *)plVar32->org)->child, plVar33 = plVar27,
       plVar27 != (lys_module *)0x0)) {
      do {
        if ((char)*(byte *)&plVar27->name < '\0') {
          if ((int)plVar12[2] == *(int *)(plVar12[1] + 4)) {
            if (plVar27 != plVar33) {
              pLVar19 = ly_errno_location();
              *pLVar19 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0xb80);
              goto LAB_0015eccb;
            }
            break;
          }
          *(byte *)&plVar27->name = *(byte *)&plVar27->name & 0x7f;
          if ((((ulong)(plVar27->ctx->dict).recs[2].value & 0x18) != 0) &&
             (((ulong)(plVar27->ctx->dict).recs[1].next & 0x100) != 0)) {
            for (uVar26 = (ulong)plVar13->number; uVar26 != 0; uVar26 = uVar26 - 1) {
              plVar6 = (plVar13->set).s[uVar26 - 1];
              if (((ly_ctx *)plVar6->name == plVar27->ctx) &&
                 (iVar9 = lyd_diff_equivnode((lyd_node *)plVar6->dsc,(lyd_node *)plVar27->org),
                 plVar13 = plStack_38, iVar9 != 0)) {
                lyd_diff_move_preprocess
                          ((diff_ordered *)plVar6,
                           *(lyd_node **)
                            (*(long *)(plVar12[1] + 8) + (ulong)*(uint *)(plVar12 + 2) * 8),
                           (lyd_node *)plVar27);
                plVar13 = plStack_38;
                break;
              }
            }
          }
          plVar11 = local_48;
          plVar7 = plVar27->ctx;
          if (((ulong)(plVar7->dict).recs[2].value & 0x11) == 0) {
            uVar10 = *(uint *)(plVar12 + 2);
          }
          else {
            plVar25 = (lys_module *)plVar27->contact;
            uVar10 = *(uint *)(plVar12 + 2);
            uVar26 = (ulong)uVar10;
            if (plVar25 != (lys_module *)0x0) {
              lVar18 = plVar12[1];
              uVar22 = *(uint *)(lVar18 + 4);
              if (uVar10 < uVar22) goto LAB_0015e822;
              goto LAB_0015e840;
            }
          }
          *(uint *)(plVar12 + 2) = uVar10 + 1;
        }
        ppcVar1 = &plVar27->dsc;
        plVar27 = (lys_module *)*ppcVar1;
      } while ((lys_module *)*ppcVar1 != (lys_module *)0x0);
    }
    else {
      plVar33 = (lys_module *)0x0;
    }
    if (plVar33 != plVar30) {
LAB_0015e664:
      if (plVar17[1] != 0) {
        *(undefined4 *)(plVar17[1] + 4) = 0;
      }
      *(undefined4 *)(plVar17 + 2) = 0;
      plVar32 = (lys_module *)plVar33->org;
      plVar28 = (lyd_node *)plVar32->dsc;
      local_80 = plVar33;
      if (plVar28 != (lyd_node *)0x0) {
        lVar18 = *plVar17;
        do {
          if ((char)plVar28->validity < '\0') {
            if (*(int *)(lVar18 + 0x10) == *(int *)(*(long *)(lVar18 + 8) + 4)) {
              plVar32 = (lys_module *)local_80->org;
              if (plVar28 == (lyd_node *)plVar32->dsc) goto LAB_0015e76d;
              uVar29 = 0xbcd;
              goto LAB_0015ebdc;
            }
            plVar28->validity = plVar28->validity & 0x7f;
            if (((plVar28->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
               ((plVar28->schema->flags & 0x100) != 0)) {
              for (uVar26 = (ulong)plVar13->number; uVar26 != 0; uVar26 = uVar26 - 1) {
                plVar6 = (plVar13->set).s[uVar26 - 1];
                if (((lys_node *)plVar6->name == plVar28->schema) &&
                   (iVar9 = lyd_diff_equivnode((lyd_node *)plVar6->dsc,plVar28->parent),
                   plVar13 = plStack_38, iVar9 != 0)) {
                  lyd_diff_move_preprocess
                            ((diff_ordered *)plVar6,
                             *(lyd_node **)
                              (*(long *)(*(long *)(lVar18 + 8) + 8) +
                              (ulong)*(uint *)(lVar18 + 0x10) * 8),plVar28);
                  plVar13 = plStack_38;
                  break;
                }
              }
            }
            plVar6 = plVar28->schema;
            if ((plVar6->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) {
              uVar10 = *(uint *)(lVar18 + 0x10);
            }
            else {
              plVar25 = (lys_module *)plVar28->child;
              uVar10 = *(uint *)(lVar18 + 0x10);
              uVar26 = (ulong)uVar10;
              if (plVar25 != (lys_module *)0x0) {
                lVar8 = *(long *)(lVar18 + 8);
                uVar22 = *(uint *)(lVar8 + 4);
                if (uVar10 < uVar22) goto LAB_0015e7bd;
                goto LAB_0015e7df;
              }
            }
            *(uint *)(lVar18 + 0x10) = uVar10 + 1;
          }
          plVar28 = plVar28->next;
        } while (plVar28 != (lyd_node *)0x0);
        plVar32 = (lys_module *)local_80->org;
      }
LAB_0015e76d:
      ly_set_free((ly_set *)plVar17[1]);
      plVar12 = (long *)*plVar17;
      free(plVar17);
      plVar11 = local_48;
      if (*plVar12 != 0) {
        plVar25 = (lys_module *)0x0;
        plVar13 = plStack_38;
        goto LAB_0015e799;
      }
    }
    plVar13 = (ly_set *)plVar12[1];
    goto LAB_0015e8f5;
  }
  goto LAB_0015e18a;
LAB_0015e495:
  uVar22 = (uint)uVar26;
  if (uVar22 == uVar10) goto LAB_0015e49a;
  goto LAB_0015e4da;
LAB_0015e822:
  if ((ly_ctx *)**(long **)(*(long *)(lVar18 + 8) + uVar26 * 8) == plVar7) goto LAB_0015e840;
  uVar26 = uVar26 + 1;
  *(int *)(plVar12 + 2) = (int)uVar26;
  if (uVar22 == uVar26) goto LAB_0015ed1d;
  goto LAB_0015e822;
LAB_0015e840:
  if ((uint)uVar26 != uVar22) {
    plVar28 = *(lyd_node **)(*(long *)(lVar18 + 8) + (uVar26 & 0xffffffff) * 8);
    local_90 = (lys_module *)plVar28->child;
    if (local_90 == (lys_module *)0x0) {
      local_88 = plVar28;
    }
    *(uint *)(plVar12 + 2) = (uint)uVar26 + 1;
    plVar17 = (long *)malloc(0x18);
    *(undefined4 *)(plVar17 + 2) = 0;
    pvVar16 = calloc(1,0x10);
    plVar17[1] = (long)pvVar16;
    *plVar17 = (long)plVar12;
    plVar13 = plStack_38;
    plVar12 = plVar17;
    goto LAB_0015e18a;
  }
LAB_0015ed1d:
  uVar29 = 0xb99;
LAB_0015ebdc:
  plVar11 = local_48;
  pLVar19 = ly_errno_location();
  *pLVar19 = LY_EINT;
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c",
         uVar29);
  plVar12 = plVar17;
joined_r0x0015ec07:
  while (plVar13 = plStack_38, plVar34 = local_60, plVar12 != (long *)0x0) {
LAB_0015eccb:
    plVar17 = (long *)*plVar12;
    ly_set_free((ly_set *)plVar12[1]);
    free(plVar12);
    plVar12 = plVar17;
  }
  goto LAB_0015ecf0;
LAB_0015e7bd:
  if ((lys_node *)**(long **)(*(long *)(lVar8 + 8) + uVar26 * 8) == plVar6) goto LAB_0015e7df;
  uVar26 = uVar26 + 1;
  *(int *)(lVar18 + 0x10) = (int)uVar26;
  if (uVar22 == uVar26) goto LAB_0015ebd3;
  goto LAB_0015e7bd;
LAB_0015e7df:
  if ((uint)uVar26 == uVar22) {
LAB_0015ebd3:
    uVar29 = 0xbe6;
    goto LAB_0015ebdc;
  }
  plVar28 = *(lyd_node **)(*(long *)(lVar8 + 8) + (uVar26 & 0xffffffff) * 8);
  local_90 = (lys_module *)plVar28->child;
  if (local_90 == (lys_module *)0x0) {
    local_88 = plVar28;
  }
  *(uint *)(lVar18 + 0x10) = (uint)uVar26 + 1;
  plVar12 = plVar17;
  plVar32 = local_80;
LAB_0015e799:
  plVar17 = plVar12;
  plVar11 = local_48;
  plVar33 = plVar32;
  if (plVar25 != (lys_module *)0x0) goto LAB_0015e18a;
  goto LAB_0015e664;
LAB_0015e8a8:
  plVar34 = (lyd_difflist *)0x0;
LAB_0015e8ab:
  plVar13 = (ly_set *)0x0;
LAB_0015ecf0:
  diff_ordset_free(plVar13);
  lyd_free_diff(plVar11);
  lyd_free_diff(plVar34);
  return (lyd_difflist *)0x0;
}

Assistant:

lyd_difflist *
lyd_diff(struct lyd_node *first, struct lyd_node *second, int options)
{
    int rc;
    struct lyd_node *elem1, *elem2, *iter, *aux, *parent = NULL, *next1, *next2;
    struct lyd_difflist *result, *result2 = NULL;
    void *new;
    unsigned int size, size2, index = 0, index2 = 0, i, j, k;
    struct matchlist_s {
        struct matchlist_s *prev;
        struct ly_set *match;
        unsigned int i;
    } *matchlist = NULL, *mlaux;
    struct ly_set *ordset = NULL;
    struct diff_ordered *ordered;
    struct diff_ordered_dist *dist_aux, *dist_iter;
    struct diff_ordered_item item_aux;

    if (!first) {
        /* all nodes in second were created,
         * but the second must be top level */
        if (second && second->parent) {
            LOGERR(LY_EINVAL, "%s: \"first\" parameter is NULL and \"second\" is not top level.", __func__);
            return NULL;
        }
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(second, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_CREATED, NULL, iter)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    } else if (!second) {
        /* all nodes from first were deleted */
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(first, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, iter, NULL)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    }

    if (options & LYD_DIFFOPT_NOSIBLINGS) {
        /* both trees must start at the same (schema) node */
        if (first->schema != second->schema) {
            LOGERR(LY_EINVAL, "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.", __func__);
            return NULL;
        }
        /* use first's and second's child to make comparison the same as without LYD_OPT_NOSIBLINGS */
        first = first->child;
        second = second->child;
    } else {
        /* go to the first sibling in both trees */
        if (first->parent) {
            first = first->parent->child;
        } else {
            while (first->prev->next) {
                first = first->prev;
            }
        }

        if (second->parent) {
            second = second->parent->child;
        } else {
            for (; second->prev->next; second = second->prev);
        }

        /* check that both has the same (schema) parent or that they are top-level nodes */
        if ((first->parent && second->parent && first->parent->schema != second->parent->schema) ||
                (!first->parent && first->parent != second->parent)) {
            LOGERR(LY_EINVAL, "%s: incompatible trees with different parents.", __func__);
            return NULL;
        }
    }
    if (first == second) {
        LOGERR(LY_EINVAL, "%s: comparing the same tree does not make sense.", __func__);
        return NULL;
    }

    /* initiate resulting structure */
    result = lyd_diff_init_difflist(&size);

    /* the records about created and moved items are created in
     * bad order, so the records about created nodes (and their
     * possible moving) is stored separately and added to the
     * main result at the end.
     */
    result2 = lyd_diff_init_difflist(&size2);

    matchlist = malloc(sizeof *matchlist);
    matchlist->i = 0;
    matchlist->match = ly_set_new();
    matchlist->prev = NULL;

    ordset = ly_set_new();

    /*
     * compare trees
     */
    /* 1) newly created nodes + changed leafs/anyxmls */
    next1 = first;
    for (elem2 = next2 = second; elem2; elem2 = next2) {
        /* keep right pointer for searching in the first tree */
        elem1 = next1;

        if (elem2->dflt && !(options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* skip default elements, they could not be created or changed, just deleted */
            goto cmp_continue;
        }

        /* search for elem2 instance in the first */
        LY_TREE_FOR(elem1, iter) {
            if (iter->schema != elem2->schema) {
                continue;
            }

            /* elem2 instance found */
            rc = lyd_diff_compare(iter, elem2, result, &size, &index, matchlist->match, ordset, options);
            if (rc == -1) {
                goto error;
            } else if (rc == 0) {
                /* match */
                break;
            } /* else, continue */
        }

        if (!iter) {
            /* elem2 not found in the first tree */
            if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_CREATED, elem1 ? elem1->parent : parent, elem2)) {
                goto error;
            }

            if (elem1 && (elem2->schema->flags & LYS_USERORDERED)) {
                /* store the correct place where the node is supposed to be moved after creation */
                /* if elem1 does not exist, all nodes were created and they will be created in
                 * correct order, so it is not needed to detect moves */
                for (aux = elem2->prev; aux->next; aux = aux->prev) {
                    if (aux->schema == elem2->schema) {
                        /* predecessor found */
                        break;
                    }
                }
                if (!aux->next) {
                    /* predecessor not found */
                    aux = NULL;
                }
                if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_MOVEDAFTER2, aux, elem2)) {
                    goto error;
                }
            }
        }

cmp_continue:
        /* select element for the next run                                    1     2
         * - first, process all siblings of a single parent                  / \   / \
         * - then, go to children (deep)                                    3   4 7   8
         * - return to the parent's next sibling children                  / \
         *                                                                5   6
         */
        /* siblings first */
        next1 = elem1;
        next2 = elem2->next;

        if (!next2) {
            /* children */

            /* first pass of the siblings done, some additional work for future
             * detection of move may be needed */
            for (i = ordset->number; i > 0; i--) {
                ordered = (struct diff_ordered *)ordset->set.g[i - 1];
                if (ordered->items) {
                    /* already preprocessed ordered structure */
                    break;
                }
                ordered->items = calloc(ordered->count, sizeof *ordered->items);
                ordered->dist = NULL;
                /* zero the count to be used as a node position in lyd_diff_move_preprocess() */
                ordered->count = 0;
            }

            /* first, get the first sibling */
            if (elem2->parent == second->parent) {
                elem2 = second;
            } else {
                elem2 = elem2->parent->child;
            }

            /* and then find the first child */
            for (iter = elem2; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    /* the iter is not present in both trees */
                    continue;
                } else if (matchlist->i == matchlist->match->number) {
                    if (iter == elem2) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, matchlist->match->set.d[matchlist->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (matchlist->i < matchlist->match->number && matchlist->match->set.d[matchlist->i]->schema != iter->schema) {
                        matchlist->i++;
                    }
                    if (matchlist->i == matchlist->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = matchlist->match->set.d[matchlist->i]->child;
                    if (!next1) {
                        parent = matchlist->match->set.d[matchlist->i];
                    }
                    matchlist->i++;
                    next2 = iter->child;
                    break;
                }
                matchlist->i++;
            }

            if (!iter) {
                /* no child/data on next level */
                if (elem2 == second) {
                    /* done */
                    break;
                }
            } else {
                /* create new matchlist item */
                mlaux = malloc(sizeof *mlaux);
                mlaux->i = 0;
                mlaux->match = ly_set_new();
                mlaux->prev = matchlist;
                matchlist = mlaux;
            }
        }

        while (!next2) {
            /* parent */

            /* clean the last match set */
            ly_set_clean(matchlist->match);
            matchlist->i = 0;

            /* try to go to a cousin - child of the next parent's sibling */
            mlaux = matchlist->prev;
            for (iter = elem2->parent->next; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    continue;
                } else if (mlaux->i == mlaux->match->number) {
                    if (iter == elem2->parent->next) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number ; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, mlaux->match->set.d[mlaux->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (mlaux->i < mlaux->match->number && mlaux->match->set.d[mlaux->i]->schema != iter->schema) {
                        mlaux->i++;
                    }
                    if (mlaux->i == mlaux->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = mlaux->match->set.d[mlaux->i]->child;
                    if (!next1) {
                        parent = mlaux->match->set.d[mlaux->i];
                    }
                    mlaux->i++;
                    next2 = iter->child;
                    break;
                }
                mlaux->i++;
            }

            /* if no cousin exists, continue next loop on higher level */
            if (!iter) {
                elem2 = elem2->parent;

                /* remove matchlist item */
                ly_set_free(matchlist->match);
                mlaux = matchlist;
                matchlist = matchlist->prev;
                free(mlaux);

                if (!matchlist->prev) { /* elem2->parent == second->parent */
                    /* done */
                    break;
                }
            }
        }
    }

    ly_set_free(matchlist->match);
    free(matchlist);
    matchlist = NULL;


    /* 2) deleted nodes */
    LY_TREE_DFS_BEGIN(first, next1, elem1) {
        /* search for elem1s deleted in the second */
        if (elem1->validity & LYD_VAL_INUSE) {
            /* erase temporary LYD_VAL_INUSE flag and continue into children */
            elem1->validity &= ~LYD_VAL_INUSE;
        } else if (!elem1->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* elem1 has no matching node in second, add it into result */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, elem1, NULL)) {
                goto error;
            }

            /* skip subtree processing of data missing in the second tree */
            goto dfs_nextsibling;
        }

        /* modified LY_TREE_DFS_END() */
        /* select element for the next run - children first */
        if (elem1->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next1 = NULL;
        } else {
            next1 = elem1->child;
        }
        if (!next1) {
dfs_nextsibling:
            /* try siblings */
            next1 = elem1->next;
        }
        while (!next1) {
            /* parent is already processed, go to its sibling */

            elem1 = elem1->parent;
            if (elem1 == first->parent) {
                /* we are done, no next element to process */
                break;
            }

            next1 = elem1->next;
        }
    }

    /* 3) moved nodes (when user-ordered) */
    for (i = 0; i < ordset->number; i++) {
        ordered = (struct diff_ordered *)ordset->set.g[i];
        if (!ordered->dist->dist) {
            /* the dist list is sorted here, but the biggest dist is 0,
             * so nothing changed in order of these items between first
             * and second. We can continue with another user-ordered list.
             */
            continue;
        }

        /* get needed movements
         * - from the biggest distances try to apply node movements
         * on first tree node until they will be ordered as in the
         * second tree - i.e. until there will be no position difference
         */

        for (dist_iter = ordered->dist; ; dist_iter = dist_iter->next) {
            /* dist list is sorted at the beginning, since applying a move causes
             * just a small change in other distances, we assume that the biggest
             * dist is the next one (note that dist list is implemented as ring
             * list). This way we avoid sorting distances after each move. The loop
             * stops when all distances are zero.
             */
            dist_aux = dist_iter;
            while (!dist_iter->dist) {
                /* no dist, so no move. Try another, but when
                 * there is no dist at all, stop the loop
                 */
                dist_iter = dist_iter->next;
                if (dist_iter == dist_aux) {
                    /* all dist we zeroed */
                    goto movedone;
                }
            }
            /* something to move */

            /* get the item to move */
            for (k = 0; k < ordered->count; k++) {
                if (ordered->items[k].dist == dist_iter) {
                    break;
                }
            }

            /* apply the move (distance) */
            memcpy(&item_aux, &ordered->items[k], sizeof item_aux);
            if (dist_iter->dist > 0) {
                /* move to right (other move to left) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k + 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist++; /* update moved item distance */
                    dist_iter->dist--;
                    k++;
                }
            } else {
                /* move to left (other move to right) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k - 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist--; /* update moved item distance */
                    dist_iter->dist++;
                    k--;
                }
            }
            memcpy(&ordered->items[k], &item_aux, sizeof *ordered->items);

            /* store the transaction into the difflist */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_MOVEDAFTER1, item_aux.first,
                                 (k > 0) ? ordered->items[k - 1].first : NULL)) {
                goto error;
            }
            continue;

movedone:
            break;
        }
    }

    diff_ordset_free(ordset);
    ordset = NULL;

    if (index2) {
        /* append result2 with newly created
         * (and possibly moved) nodes */
        if (index + index2 + 1 >= size) {
            /* result must be enlarged */
            size = index + index2 + 1;
            new = realloc(result->type, size * sizeof *result->type);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->type = new;

            new = realloc(result->first, size * sizeof *result->first);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->first = new;

            new = realloc(result->second, size * sizeof *result->second);
            if (!new) {
                LOGMEM ;
                goto error;
            }
            result->second = new;
        }

        /* append */
        memcpy(&result->type[index], result2->type, (index2 + 1) * sizeof *result->type);
        memcpy(&result->first[index], result2->first, (index2 + 1) * sizeof *result->first);
        memcpy(&result->second[index], result2->second, (index2 + 1) * sizeof *result->second);
    }
    lyd_free_diff(result2);

    ly_err_clean(1);
    return result;

error:

    while (matchlist) {
        mlaux = matchlist;
        matchlist = mlaux->prev;
        ly_set_free(mlaux->match);
        free(mlaux);

    }
    diff_ordset_free(ordset);

    lyd_free_diff(result);
    lyd_free_diff(result2);

    return NULL;
}